

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

ostream * doctest::anon_unknown_14::operator<<(ostream *os,XmlEncode *xmlEncode)

{
  logic_error c;
  pointer pcVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  long lVar6;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  size_t n;
  long lVar11;
  ulong uVar12;
  logic_error local_48 [16];
  ulong local_38;
  ulong uVar13;
  
  uVar4 = (xmlEncode->m_str)._M_string_length;
  if (uVar4 != 0) {
    uVar12 = 0;
    do {
      pcVar1 = (xmlEncode->m_str)._M_dataplus._M_p;
      c = *(logic_error *)(pcVar1 + uVar12);
      uVar9 = (uint)(byte)c;
      uVar13 = uVar12;
      if ((byte)c < 0x3c) {
        if (uVar9 == 0x22) {
          if (xmlEncode->m_forWhat == ForAttributes) {
            lVar6 = 6;
            pcVar7 = "&quot;";
          }
          else {
LAB_0010ffe5:
            lVar6 = 1;
            pcVar7 = (char *)local_48;
            local_48[0] = c;
          }
          goto LAB_0010fff3;
        }
        if (uVar9 == 0x26) {
          lVar6 = 5;
          pcVar7 = "&amp;";
          goto LAB_0010fff3;
        }
LAB_0010ff83:
        if (((byte)c < 9) || (c == (logic_error)0x7f || (byte)((char)c - 0xeU) < 0x12)) {
LAB_0010ff9f:
          anon_unknown_35::hexEscapeChar(os,(uchar)c);
        }
        else {
          if ((byte)c < 0x7f) goto LAB_0010ffe5;
          if ((byte)((char)c + 8U) < 200) goto LAB_0010ff9f;
          uVar8 = uVar9 & 0xffffffe0;
          if (uVar8 == 0xc0) {
            lVar6 = 2;
LAB_0011003d:
            bVar5 = 0;
          }
          else {
            if (((byte)c & 0xf0) == 0xe0) {
              lVar6 = 3;
              goto LAB_0011003d;
            }
            if (((byte)c & 0xf8) != 0xf0) {
              std::logic_error::logic_error
                        (local_48,
                         "/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]cinatra/tests/doctest/doctest.h:4893: Internal doctest error: Invalid multibyte utf-8 start byte encountered"
                        );
              throw_exception<std::logic_error>(local_48);
            }
            lVar6 = 4;
            bVar5 = 1;
          }
          uVar10 = (uVar12 + lVar6) - 1;
          if (uVar10 < uVar4) {
            uVar3 = 0x1f;
            if (((uVar8 != 0xc0) && (uVar3 = 0xf, ((byte)c & 0xf0) != 0xe0)) &&
               (uVar3 = 7, ((byte)c & 0xf8) != 0xf0)) {
              std::logic_error::logic_error
                        (local_48,
                         "/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]cinatra/tests/doctest/doctest.h:4906: Internal doctest error: Invalid multibyte utf-8 start byte encountered"
                        );
              throw_exception<std::logic_error>(local_48);
            }
            uVar3 = uVar3 & uVar9;
            bVar2 = true;
            lVar11 = 1;
            do {
              bVar2 = (bool)(bVar2 & ((byte)pcVar1[lVar11 + uVar12] & 0xffffffc0) == 0x80);
              uVar9 = uVar3 << 6;
              uVar3 = (byte)pcVar1[lVar11 + uVar12] & 0x3f | uVar9;
              lVar11 = lVar11 + 1;
            } while (lVar6 != lVar11);
            local_38 = uVar10;
            if ((((bVar2) && (0x7f < uVar9)) && (uVar8 == 0xc0 || 0x7ff < uVar9)) &&
               ((!(bool)(bVar5 & uVar3 - 0x801 < 0xf7ff) && (uVar9 < 0x110000)))) {
              do {
                local_48[0] = *(logic_error *)((xmlEncode->m_str)._M_dataplus._M_p + uVar12);
                std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_48,1);
                uVar12 = uVar12 + 1;
                lVar6 = lVar6 + -1;
                uVar13 = local_38;
              } while (lVar6 != 0);
              goto LAB_0010fff8;
            }
          }
          anon_unknown_35::hexEscapeChar(os,(uchar)c);
        }
      }
      else {
        if (c == (logic_error)0x3e) {
          if (((uVar12 < 3) || (pcVar1[uVar12 - 1] != ']')) || (pcVar1[uVar12 - 2] != ']'))
          goto LAB_0010ffe5;
          lVar6 = 4;
          pcVar7 = "&gt;";
        }
        else {
          if (uVar9 != 0x3c) goto LAB_0010ff83;
          lVar6 = 4;
          pcVar7 = "&lt;";
        }
LAB_0010fff3:
        std::__ostream_insert<char,std::char_traits<char>>(os,pcVar7,lVar6);
      }
LAB_0010fff8:
      uVar12 = uVar13 + 1;
      uVar4 = (xmlEncode->m_str)._M_string_length;
    } while (uVar12 < uVar4);
  }
  return os;
}

Assistant:

std::ostream& operator << ( std::ostream& os, XmlEncode const& xmlEncode ) {
        xmlEncode.encodeTo( os );
        return os;
    }